

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,int jobs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *__rhs;
  cmGlobalGenerator *pcVar4;
  pointer pcVar5;
  cmake *other;
  string *psVar6;
  cmGlobalGenerator *gen;
  allocator<char> local_bf1;
  int ret;
  allocator<char> local_bc9;
  string local_bc8;
  allocator<char> local_ba1;
  string local_ba0;
  allocator<char> local_b79;
  string local_b78;
  allocator<char> local_b51;
  string local_b50;
  string *local_b30;
  allocator<char> local_b21;
  string local_b20;
  allocator<char> local_af9;
  string local_af8;
  cmValue local_ad8;
  cmValue recursionDepth;
  allocator<char> local_ac1;
  string local_ac0;
  allocator<char> local_a99;
  string local_a98;
  cmValue local_a78;
  cmValue config;
  string local_a68;
  allocator<char> local_a41;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  string local_990 [32];
  undefined1 local_970 [8];
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gg;
  cmake cm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_78 [8];
  cmWorkingDirectory workdir;
  bool fast_local;
  string *targetName_local;
  string *projectName_local;
  string *bindir_local;
  string *srcdir_local;
  cmMakefile *this_local;
  
  this->IsSourceFileTryCompile = fast;
  bVar1 = cmsys::SystemTools::FileIsDirectory(bindir);
  if (!bVar1) {
    register0x00000000 = cmsys::SystemTools::MakeDirectory(bindir,(mode_t *)0x0);
  }
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_78,bindir);
  bVar1 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_78);
  if (bVar1) {
    std::operator+(&local_e8,"Failed to set working directory to ",bindir);
    std::operator+(&local_c8,&local_e8," : ");
    iVar3 = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_78);
    __rhs = strerror(iVar3);
    std::operator+(&local_a8,&local_c8,__rhs);
    IssueMessage(this,FATAL_ERROR,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    this_local._4_4_ = 1;
  }
  else {
    cmake::cmake((cmake *)&gg,RoleProject,Project,TryCompile);
    pcVar4 = GetGlobalGenerator(this);
    (*pcVar4->_vptr_cmGlobalGenerator[3])(local_990);
    cmake::CreateGlobalGenerator((cmake *)local_970,(string *)&gg,SUB81(local_990,0));
    std::__cxx11::string::~string(local_990);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_970);
    if (bVar1) {
      iVar3 = this->RecursionDepth;
      pcVar5 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
               operator->((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                          local_970);
      pcVar5->RecursionDepth = iVar3;
      std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::unique_ptr
                (&local_9f8,
                 (unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)local_970
                );
      cmake::SetGlobalGenerator((cmake *)&gg,&local_9f8);
      std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                (&local_9f8);
      other = GetCMakeInstance(this);
      cmake::SetTraceRedirect((cmake *)&gg,other);
      cmake::SetHomeDirectory((cmake *)&gg,srcdir);
      cmake::SetHomeOutputDirectory((cmake *)&gg,bindir);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a18,"CMAKE_GENERATOR_INSTANCE",&local_a19);
      psVar6 = GetSafeDefinition(this,&local_a18);
      cmake::SetGeneratorInstance((cmake *)&gg,psVar6);
      std::__cxx11::string::~string((string *)&local_a18);
      std::allocator<char>::~allocator(&local_a19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a40,"CMAKE_GENERATOR_PLATFORM",&local_a41);
      psVar6 = GetSafeDefinition(this,&local_a40);
      cmake::SetGeneratorPlatform((cmake *)&gg,psVar6);
      std::__cxx11::string::~string((string *)&local_a40);
      std::allocator<char>::~allocator(&local_a41);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a68,"CMAKE_GENERATOR_TOOLSET",
                 (allocator<char> *)((long)&config.Value + 7));
      psVar6 = GetSafeDefinition(this,&local_a68);
      cmake::SetGeneratorToolset((cmake *)&gg,psVar6);
      std::__cxx11::string::~string((string *)&local_a68);
      std::allocator<char>::~allocator((allocator<char> *)((long)&config.Value + 7));
      cmake::LoadCache((cmake *)&gg);
      pcVar4 = cmake::GetGlobalGenerator((cmake *)&gg);
      uVar2 = (*pcVar4->_vptr_cmGlobalGenerator[0x26])();
      if ((uVar2 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a98,"CMAKE_TRY_COMPILE_CONFIGURATION",&local_a99);
        local_a78 = GetDefinition(this,&local_a98);
        std::__cxx11::string::~string((string *)&local_a98);
        std::allocator<char>::~allocator(&local_a99);
        bVar1 = cmValue::operator_cast_to_bool(&local_a78);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ac0,"CMAKE_BUILD_TYPE",&local_ac1);
          recursionDepth.Value = local_a78.Value;
          cmake::AddCacheEntry((cmake *)&gg,&local_ac0,local_a78,"Build configuration",3);
          std::__cxx11::string::~string((string *)&local_ac0);
          std::allocator<char>::~allocator(&local_ac1);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_af8,"CMAKE_MAXIMUM_RECURSION_DEPTH",&local_af9);
      local_ad8 = GetDefinition(this,&local_af8);
      std::__cxx11::string::~string((string *)&local_af8);
      std::allocator<char>::~allocator(&local_af9);
      bVar1 = cmValue::operator_cast_to_bool(&local_ad8);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b20,"CMAKE_MAXIMUM_RECURSION_DEPTH",&local_b21);
        local_b30 = local_ad8.Value;
        cmake::AddCacheEntry((cmake *)&gg,&local_b20,local_ad8,"Maximum recursion depth",3);
        std::__cxx11::string::~string((string *)&local_b20);
        std::allocator<char>::~allocator(&local_b21);
      }
      if (cmakeArgs !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        cmake::SetWarnUnusedCli((cmake *)&gg,false);
        cmake::SetCacheArgs((cmake *)&gg,cmakeArgs);
      }
      pcVar4 = cmake::GetGlobalGenerator((cmake *)&gg);
      gen = GetGlobalGenerator(this);
      cmGlobalGenerator::EnableLanguagesFromGenerator(pcVar4,gen,this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b50,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_b51);
      bVar1 = IsOn(this,&local_b50);
      std::__cxx11::string::~string((string *)&local_b50);
      std::allocator<char>::~allocator(&local_b51);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b78,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_b79);
        cmake::AddCacheEntry((cmake *)&gg,&local_b78,"TRUE","",4);
        std::__cxx11::string::~string((string *)&local_b78);
        std::allocator<char>::~allocator(&local_b79);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ba0,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_ba1);
        cmake::AddCacheEntry((cmake *)&gg,&local_ba0,"FALSE","",4);
        std::__cxx11::string::~string((string *)&local_ba0);
        std::allocator<char>::~allocator(&local_ba1);
      }
      iVar3 = cmake::Configure((cmake *)&gg);
      if (iVar3 == 0) {
        iVar3 = cmake::Generate((cmake *)&gg);
        if (iVar3 == 0) {
          pcVar4 = GetGlobalGenerator(this);
          this_local._4_4_ =
               cmGlobalGenerator::TryCompile
                         (pcVar4,jobs,srcdir,bindir,projectName,targetName,fast,output,this);
          this->IsSourceFileTryCompile = false;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ret,"Failed to generate test project build system.",&local_bf1);
          IssueMessage(this,FATAL_ERROR,(string *)&ret);
          std::__cxx11::string::~string((string *)&ret);
          std::allocator<char>::~allocator(&local_bf1);
          cmSystemTools::SetFatalErrorOccurred();
          this->IsSourceFileTryCompile = false;
          this_local._4_4_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_bc8,"Failed to configure test project build system.",&local_bc9)
        ;
        IssueMessage(this,FATAL_ERROR,&local_bc8);
        std::__cxx11::string::~string((string *)&local_bc8);
        std::allocator<char>::~allocator(&local_bc9);
        cmSystemTools::SetFatalErrorOccurred();
        this->IsSourceFileTryCompile = false;
        this_local._4_4_ = 1;
      }
    }
    else {
      pcVar4 = GetGlobalGenerator(this);
      (*pcVar4->_vptr_cmGlobalGenerator[3])(&local_9f0);
      std::operator+(&local_9d0,"Global generator \'",&local_9f0);
      std::operator+(&local_9b0,&local_9d0,"\' could not be created.");
      IssueMessage(this,INTERNAL_ERROR,&local_9b0);
      std::__cxx11::string::~string((string *)&local_9b0);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::__cxx11::string::~string((string *)&local_9f0);
      cmSystemTools::SetFatalErrorOccurred();
      this->IsSourceFileTryCompile = false;
      this_local._4_4_ = 1;
    }
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
              ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)local_970);
    cmake::~cmake((cmake *)&gg);
  }
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_78);
  return this_local._4_4_;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName, bool fast, int jobs,
                           const std::vector<std::string>* cmakeArgs,
                           std::string& output)
{
  this->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir)) {
    cmSystemTools::MakeDirectory(bindir);
  }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  cmWorkingDirectory workdir(bindir);
  if (workdir.Failed()) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to set working directory to " + bindir + " : " +
                         std::strerror(workdir.GetLastResult()));
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm(cmake::RoleProject, cmState::Project,
           cmState::ProjectKind::TryCompile);
  auto gg = cm.CreateGlobalGenerator(this->GetGlobalGenerator()->GetName());
  if (!gg) {
    this->IssueMessage(MessageType::INTERNAL_ERROR,
                       "Global generator '" +
                         this->GetGlobalGenerator()->GetName() +
                         "' could not be created.");
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }
  gg->RecursionDepth = this->RecursionDepth;
  cm.SetGlobalGenerator(std::move(gg));

  // copy trace state
  cm.SetTraceRedirect(this->GetCMakeInstance());

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorInstance(this->GetSafeDefinition("CMAKE_GENERATOR_INSTANCE"));
  cm.SetGeneratorPlatform(this->GetSafeDefinition("CMAKE_GENERATOR_PLATFORM"));
  cm.SetGeneratorToolset(this->GetSafeDefinition("CMAKE_GENERATOR_TOOLSET"));
  cm.LoadCache();
  if (!cm.GetGlobalGenerator()->IsMultiConfig()) {
    if (cmValue config =
          this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION")) {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config, "Build configuration",
                       cmStateEnums::STRING);
    }
  }
  cmValue recursionDepth =
    this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (recursionDepth) {
    cm.AddCacheEntry("CMAKE_MAXIMUM_RECURSION_DEPTH", recursionDepth,
                     "Maximum recursion depth", cmStateEnums::STRING);
  }
  // if cmake args were provided then pass them in
  if (cmakeArgs) {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs for options like --no-warn-unused-cli.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --no-warn-unused-cli.
    cm.SetWarnUnusedCli(false);
    // cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
  }
  // to save time we pass the EnableLanguage info directly
  cm.GetGlobalGenerator()->EnableLanguagesFromGenerator(
    this->GetGlobalGenerator(), this);
  if (this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE", "",
                     cmStateEnums::INTERNAL);
  } else {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE", "",
                     cmStateEnums::INTERNAL);
  }
  if (cm.Configure() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to configure test project build system.");
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  if (cm.Generate() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to generate test project build system.");
    cmSystemTools::SetFatalErrorOccurred();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(
    jobs, srcdir, bindir, projectName, targetName, fast, output, this);

  this->IsSourceFileTryCompile = false;
  return ret;
}